

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

bool CoreML::Specification::ArrayFeatureType_ArrayDataType_IsValid(int value)

{
  if (value < 0x10040) {
    if ((value != 0) && (value != 0x10020)) {
      return false;
    }
  }
  else if ((value != 0x10040) && (value != 0x20020)) {
    return false;
  }
  return true;
}

Assistant:

bool ArrayFeatureType_ArrayDataType_IsValid(int value) {
  switch (value) {
    case 0:
    case 65568:
    case 65600:
    case 131104:
      return true;
    default:
      return false;
  }
}